

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_table.cpp
# Opt level: O2

void __thiscall
InlineTable_WithQuotedKey_Test::~InlineTable_WithQuotedKey_Test
          (InlineTable_WithQuotedKey_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(InlineTable, WithQuotedKey) {
    std::istringstream input("key = { \"key\\nkey\"  =\t123   } ");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::key, "key"},
        {sax_event_t::start_inline_table},
        {sax_event_t::key, "key\nkey"},
        {sax_event_t::integer, 123},
        {sax_event_t::finish_inline_table, 1},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}